

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

vector<Catch::StringRef,_std::allocator<Catch::StringRef>_> *
Catch::Detail::parseEnums(StringRef enums)

{
  StringRef enumInstance;
  StringRef ref;
  bool bVar1;
  vector<Catch::StringRef,_std::allocator<Catch::StringRef>_> *in_RDI;
  StringRef SVar2;
  StringRef SVar3;
  StringRef *enumValue;
  iterator __end2;
  iterator __begin2;
  vector<Catch::StringRef,_std::allocator<Catch::StringRef>_> *__range2;
  vector<Catch::StringRef,_std::allocator<Catch::StringRef>_> enumValues;
  vector<Catch::StringRef,_std::allocator<Catch::StringRef>_> *parsed;
  value_type *in_stack_ffffffffffffff08;
  vector<Catch::StringRef,_std::allocator<Catch::StringRef>_> *in_stack_ffffffffffffff10;
  size_type in_stack_ffffffffffffff20;
  char *in_stack_ffffffffffffff28;
  char *pcVar4;
  vector<Catch::StringRef,_std::allocator<Catch::StringRef>_> *this;
  vector<Catch::StringRef,_std::allocator<Catch::StringRef>_> *this_00;
  undefined8 in_stack_ffffffffffffff78;
  char *in_stack_ffffffffffffff80;
  size_type in_stack_ffffffffffffff88;
  __normal_iterator<Catch::StringRef_*,_std::vector<Catch::StringRef,_std::allocator<Catch::StringRef>_>_>
  local_70;
  vector<Catch::StringRef,_std::allocator<Catch::StringRef>_> *local_68;
  undefined1 local_49;
  vector<Catch::StringRef,_std::allocator<Catch::StringRef>_> local_30 [2];
  
  this = local_30;
  SVar3.m_size = in_stack_ffffffffffffff88;
  SVar3.m_start = in_stack_ffffffffffffff80;
  this_00 = in_RDI;
  splitStringRef(SVar3,(char)((ulong)in_stack_ffffffffffffff78 >> 0x38));
  local_49 = 0;
  clara::std::vector<Catch::StringRef,_std::allocator<Catch::StringRef>_>::vector
            ((vector<Catch::StringRef,_std::allocator<Catch::StringRef>_> *)0x25f995);
  clara::std::vector<Catch::StringRef,_std::allocator<Catch::StringRef>_>::size(this);
  clara::std::vector<Catch::StringRef,_std::allocator<Catch::StringRef>_>::reserve
            (this_00,(size_type)this);
  local_68 = local_30;
  local_70._M_current =
       (StringRef *)
       clara::std::vector<Catch::StringRef,_std::allocator<Catch::StringRef>_>::begin
                 ((vector<Catch::StringRef,_std::allocator<Catch::StringRef>_> *)
                  in_stack_ffffffffffffff08);
  clara::std::vector<Catch::StringRef,_std::allocator<Catch::StringRef>_>::end
            ((vector<Catch::StringRef,_std::allocator<Catch::StringRef>_> *)
             in_stack_ffffffffffffff08);
  SVar2.m_size = in_stack_ffffffffffffff20;
  SVar2.m_start = in_stack_ffffffffffffff28;
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<Catch::StringRef_*,_std::vector<Catch::StringRef,_std::allocator<Catch::StringRef>_>_>
                        *)in_stack_ffffffffffffff10,
                       (__normal_iterator<Catch::StringRef_*,_std::vector<Catch::StringRef,_std::allocator<Catch::StringRef>_>_>
                        *)in_stack_ffffffffffffff08);
    pcVar4 = SVar2.m_start;
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<Catch::StringRef_*,_std::vector<Catch::StringRef,_std::allocator<Catch::StringRef>_>_>
    ::operator*(&local_70);
    enumInstance.m_size = (size_type)in_RDI;
    enumInstance.m_start = pcVar4;
    SVar2 = anon_unknown_0::extractInstanceName(enumInstance);
    ref.m_size = (size_type)this_00;
    ref.m_start = (char *)this;
    SVar3 = trim(ref);
    in_stack_ffffffffffffff10 =
         (vector<Catch::StringRef,_std::allocator<Catch::StringRef>_> *)SVar3.m_size;
    clara::std::vector<Catch::StringRef,_std::allocator<Catch::StringRef>_>::push_back
              (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    __gnu_cxx::
    __normal_iterator<Catch::StringRef_*,_std::vector<Catch::StringRef,_std::allocator<Catch::StringRef>_>_>
    ::operator++(&local_70);
  }
  local_49 = 1;
  clara::std::vector<Catch::StringRef,_std::allocator<Catch::StringRef>_>::~vector
            ((vector<Catch::StringRef,_std::allocator<Catch::StringRef>_> *)SVar2.m_size);
  return in_RDI;
}

Assistant:

std::vector<StringRef> parseEnums( StringRef enums ) {
            auto enumValues = splitStringRef( enums, ',' );
            std::vector<StringRef> parsed;
            parsed.reserve( enumValues.size() );
            for( auto const& enumValue : enumValues ) {
                parsed.push_back(trim(extractInstanceName(enumValue)));
            }
            return parsed;
        }